

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSetOption(HelicsEndpoint end,int option,int value,HelicsError *err)

{
  undefined8 *puVar1;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (end == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001af37a;
    }
    else {
      bVar2 = *(int *)((long)end + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar2) {
        puVar1 = (undefined8 *)end;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001af37c;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001af37a:
  puVar1 = (undefined8 *)0x0;
LAB_001af37c:
  if (puVar1 != (undefined8 *)0x0) {
    (**(code **)(*(long *)*puVar1 + 0x10))();
  }
  return;
}

Assistant:

void helicsEndpointSetOption(HelicsEndpoint end, int option, int value, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}